

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O1

bool __thiscall Tag::getCloseTag(Tag *this,string *s)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"</",2);
  StreamObject::getName_abi_cxx11_(&local_1c0,&this->super_StreamObject);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  __n = s->_M_string_length;
  if (__n == local_1c0._M_string_length) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp((s->_M_dataplus)._M_p,local_1c0._M_dataplus._M_p,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return bVar3;
}

Assistant:

bool Tag::getCloseTag( std::string &s )
{
	bool success = true;

	std::stringstream stream;

	stream << "</" << getName() << ">";

	if ( s != stream.str() )
	{
		//std::cerr << "Syntax error: \"</" << getName() << ">\" expected." << std::endl;
		success = false;
	}

	return success;
}